

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.h
# Opt level: O3

string * trun::Config::ModuleExecutionTypeToStr_abi_cxx11_(ModuleExecutionType type)

{
  int iVar1;
  iterator iVar2;
  string *psVar3;
  long lVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  undefined1 local_7f;
  undefined1 local_7e;
  undefined1 local_7d;
  key_type local_7c;
  ModuleExecutionType local_78 [2];
  pair<const_trun::ModuleExecutionType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  pair<const_trun::ModuleExecutionType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  
  if (ModuleExecutionTypeToStr[abi:cxx11](trun::ModuleExecutionType)::type2str_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&ModuleExecutionTypeToStr[abi:cxx11](trun::ModuleExecutionType)::
                                 type2str_abi_cxx11_);
    if (iVar1 != 0) {
      local_78[1] = 0;
      std::
      pair<const_trun::ModuleExecutionType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<trun::ModuleExecutionType,_const_char_(&)[11],_true>
                (&local_70,local_78 + 1,(char (*) [11])"Sequential");
      local_78[0] = kParallel;
      std::
      pair<const_trun::ModuleExecutionType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<trun::ModuleExecutionType,_const_char_(&)[9],_true>
                (&local_48,local_78,(char (*) [9])"Parallel");
      std::
      _Hashtable<trun::ModuleExecutionType,std::pair<trun::ModuleExecutionType_const,std::__cxx11::string>,std::allocator<std::pair<trun::ModuleExecutionType_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<trun::ModuleExecutionType>,std::hash<trun::ModuleExecutionType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_Hashtable<std::pair<trun::ModuleExecutionType_const,std::__cxx11::string>const*>
                ((_Hashtable<trun::ModuleExecutionType,std::pair<trun::ModuleExecutionType_const,std::__cxx11::string>,std::allocator<std::pair<trun::ModuleExecutionType_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<trun::ModuleExecutionType>,std::hash<trun::ModuleExecutionType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&ModuleExecutionTypeToStr[abi:cxx11](trun::ModuleExecutionType)::
                     type2str_abi_cxx11_,&local_70,&stack0xffffffffffffffe0,0,&local_7d,&local_7e,
                 &local_7f);
      lVar4 = -0x50;
      paVar5 = &local_48.second.field_2;
      do {
        if (paVar5 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(&paVar5->_M_allocated_capacity)[-2]) {
          operator_delete((long *)(&paVar5->_M_allocated_capacity)[-2],
                          paVar5->_M_allocated_capacity + 1);
        }
        paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(&paVar5->_M_allocated_capacity + -5);
        lVar4 = lVar4 + 0x28;
      } while (lVar4 != 0);
      __cxa_atexit(std::
                   unordered_map<trun::ModuleExecutionType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<trun::ModuleExecutionType>,_std::equal_to<trun::ModuleExecutionType>,_std::allocator<std::pair<const_trun::ModuleExecutionType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::~unordered_map,
                   &ModuleExecutionTypeToStr[abi:cxx11](trun::ModuleExecutionType)::
                    type2str_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&ModuleExecutionTypeToStr[abi:cxx11](trun::ModuleExecutionType)::
                           type2str_abi_cxx11_);
    }
  }
  if (ModuleExecutionTypeToStr[abi:cxx11](trun::ModuleExecutionType)::unknown_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&ModuleExecutionTypeToStr[abi:cxx11](trun::ModuleExecutionType)::
                                 unknown_abi_cxx11_);
    if (iVar1 != 0) {
      ModuleExecutionTypeToStr[abi:cxx11](trun::ModuleExecutionType)::unknown_abi_cxx11_._M_dataplus
      ._M_p = (pointer)&ModuleExecutionTypeToStr[abi:cxx11](trun::ModuleExecutionType)::
                        unknown_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 &ModuleExecutionTypeToStr[abi:cxx11](trun::ModuleExecutionType)::unknown_abi_cxx11_
                 ,"unknown","");
      __cxa_atexit(std::__cxx11::string::~string,
                   &ModuleExecutionTypeToStr[abi:cxx11](trun::ModuleExecutionType)::
                    unknown_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&ModuleExecutionTypeToStr[abi:cxx11](trun::ModuleExecutionType)::
                           unknown_abi_cxx11_);
    }
  }
  iVar2 = std::
          _Hashtable<trun::ModuleExecutionType,_std::pair<const_trun::ModuleExecutionType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_trun::ModuleExecutionType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<trun::ModuleExecutionType>,_std::hash<trun::ModuleExecutionType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&ModuleExecutionTypeToStr[abi:cxx11](trun::ModuleExecutionType)::
                  type2str_abi_cxx11_._M_h,&local_7c);
  if (iVar2.
      super__Node_iterator_base<std::pair<const_trun::ModuleExecutionType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    psVar3 = &ModuleExecutionTypeToStr[abi:cxx11](trun::ModuleExecutionType)::unknown_abi_cxx11_;
  }
  else {
    psVar3 = std::__detail::
             _Map_base<trun::ModuleExecutionType,_std::pair<const_trun::ModuleExecutionType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_trun::ModuleExecutionType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<trun::ModuleExecutionType>,_std::hash<trun::ModuleExecutionType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<trun::ModuleExecutionType,_std::pair<const_trun::ModuleExecutionType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_trun::ModuleExecutionType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<trun::ModuleExecutionType>,_std::hash<trun::ModuleExecutionType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&ModuleExecutionTypeToStr[abi:cxx11](trun::ModuleExecutionType)::
                              type2str_abi_cxx11_,&local_7c);
  }
  return psVar3;
}

Assistant:

static const std::string &ModuleExecutionTypeToStr(ModuleExecutionType type) {
            static std::unordered_map<ModuleExecutionType, std::string> type2str = {
                    {ModuleExecutionType::kSequential, "Sequential"},
                    {ModuleExecutionType::kParallel, "Parallel"},
            };
            static std::string unknown = "unknown";
            if (type2str.find(type) == type2str.end()) {
                return unknown;
            }
            return type2str[type];
        }